

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

result * __thiscall
lest::expression_lhs<std::__cxx11::string_const&>::operator==
          (result *__return_storage_ptr__,expression_lhs<std::__cxx11::string_const&> *this,
          char (*rhs) [3])

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  lest *this_00;
  size_type sVar2;
  int iVar3;
  char *pcVar4;
  char (*in_R8) [3];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  bool local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  iVar3 = std::__cxx11::string::compare(*(char **)this);
  this_00 = *(lest **)this;
  local_d8 = &local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"==","");
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  if (local_d8 == &local_c8) {
    local_98.field_2._8_8_ = local_c8._8_8_;
  }
  else {
    local_98._M_dataplus._M_p = (pointer)local_d8;
  }
  local_98.field_2._M_allocated_capacity._1_7_ = local_c8._M_allocated_capacity._1_7_;
  local_98.field_2._M_local_buf[0] = local_c8._M_local_buf[0];
  local_98._M_string_length = local_d0;
  local_d0 = 0;
  local_c8._M_local_buf[0] = '\0';
  local_d8 = &local_c8;
  to_string<std::__cxx11::string,char[3]>(&local_b8,this_00,&local_98,(string *)rhs,in_R8);
  sVar2 = local_b8._M_string_length;
  paVar1 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p == paVar1) {
    local_68._8_4_ = local_b8.field_2._8_4_;
    local_68._12_4_ = local_b8.field_2._12_4_;
    local_b8._M_dataplus._M_p = (pointer)&local_68;
  }
  local_68._M_allocated_capacity._4_4_ = local_b8.field_2._M_allocated_capacity._4_4_;
  local_68._M_allocated_capacity._0_4_ = local_b8.field_2._M_allocated_capacity._0_4_;
  local_70 = local_b8._M_string_length;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_allocated_capacity._0_4_ =
       local_b8.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  pcVar4 = local_b8._M_dataplus._M_p + sVar2;
  local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_b8._M_dataplus._M_p;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  local_58 = iVar3 == 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_78,pcVar4);
  __return_storage_ptr__->passed = local_58;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_50,local_48 + (long)local_50);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT44(local_b8.field_2._M_allocated_capacity._4_4_,
                             local_b8.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0])
                             + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator==( R const & rhs ) { return result( lhs == rhs, to_string( lhs, "==", rhs ) ); }